

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusplatformmenu_p.cpp
# Opt level: O2

int __thiscall QDBusPlatformMenu::qt_metacall(QDBusPlatformMenu *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  Call _c_00;
  
  _id_00 = QPlatformMenu::qt_metacall((QPlatformMenu *)this,_c,_id,_a);
  if ((int)_id_00 < 0) {
    return _id_00;
  }
  if (_c == RegisterMethodArgumentMetaType) {
    if (2 < _id_00) goto LAB_00598002;
    _c_00 = RegisterMethodArgumentMetaType;
  }
  else {
    if (_c != InvokeMetaMethod) {
      return _id_00;
    }
    if (2 < _id_00) goto LAB_00598002;
    _c_00 = InvokeMetaMethod;
  }
  qt_static_metacall((QObject *)this,_c_00,_id_00,_a);
LAB_00598002:
  return _id_00 - 3;
}

Assistant:

int QDBusPlatformMenu::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QPlatformMenu::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 3)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 3)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
    return _id;
}